

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple>
          (Node<QString,_QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  QtInstallDirectoryWithTriple *in_RDI;
  long in_FS_OFFSET;
  QtInstallDirectoryWithTriple *this_00;
  QtInstallDirectoryWithTriple local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_48;
  QtInstallDirectoryWithTriple::QtInstallDirectoryWithTriple(this_00,in_RDI);
  QtInstallDirectoryWithTriple::operator=(this_00,in_RDI);
  QtInstallDirectoryWithTriple::~QtInstallDirectoryWithTriple(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }